

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O3

void __thiscall
kj::_::CoroutineBase::CoroutineBase
          (CoroutineBase *this,coroutine_handle<void> coroutine,ExceptionOrValue *resultRef,
          SourceLocation location)

{
  EventLoop *pEVar1;
  
  (this->super_PromiseNode).super_PromiseArenaMember.arena = (PromiseArena *)0x0;
  (this->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember =
       (_func_int **)&PTR___cxa_pure_virtual_006dd340;
  (this->super_Event)._vptr_Event = (_func_int **)&PTR___cxa_pure_virtual_006dda40;
  pEVar1 = anon_unknown_173::currentEventLoop();
  (this->super_Event).loop = pEVar1;
  (this->super_Event).next = (Event *)0x0;
  (this->super_Event).prev = (Event **)0x0;
  (this->super_Event).firing = false;
  (this->super_Event).live = 0x1e366381;
  (this->super_Event).location.fileName = location.fileName;
  (this->super_Event).location.function = location.function;
  (this->super_Event).location.lineNumber = location.lineNumber;
  (this->super_Event).location.columnNumber = location.columnNumber;
  (this->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember =
       (_func_int **)&PTR_destroy_006dd270;
  (this->super_Event)._vptr_Event = (_func_int **)&PTR_traceEvent_006dd2b8;
  (this->coroutine)._M_fr_ptr = coroutine._M_fr_ptr;
  this->resultRef = resultRef;
  (this->onReadyEvent).event = (Event *)0x0;
  this->waiting = true;
  this->hasSuspendedAtLeastOnce = false;
  (this->promiseNodeForTrace).ptr = (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)0x0;
  UnwindDetector::UnwindDetector(&this->unwindDetector);
  (this->maybeDisposalResults).ptr = (DisposalResults *)0x0;
  return;
}

Assistant:

CoroutineBase::CoroutineBase(stdcoro::coroutine_handle<> coroutine, ExceptionOrValue& resultRef,
                             SourceLocation location)
    : Event(location),
      coroutine(coroutine),
      resultRef(resultRef) {}